

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_-1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,_-1,_false>_>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,_-1,_false>_>,_1,_0,_0>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,__1,_false>_>_>
           *dst,CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,__1,_false>_>
                *src)

{
  Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false> *pBVar1;
  PointerType pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  
  pBVar1 = dst->m_matrix;
  lVar3 = (pBVar1->super_BlockImpl<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false,_Eigen::Dense>
          ).super_BlockImpl_dense<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false>,_0>.m_cols.
          m_value;
  pdVar4 = (src->m_xpr).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>,_1,__1,_false>,_0>
           .m_data;
  lVar5 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar5;
  }
  for (; lVar3 != lVar5; lVar5 = lVar5 + 1) {
    pdVar2 = (pBVar1->
             super_BlockImpl<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,__1,_false>,_0>.
             m_data;
    pdVar2[lVar5] = pdVar2[lVar5] - *pdVar4 * *pdVar4;
    pdVar4 = pdVar4 + 4;
  }
  return;
}

Assistant:

inline Index cols() const { return m_matrix.cols(); }